

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SchemaErrorPointer
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,SchemaErrorCode code,PointerType *location,Ch *value,SizeType length,
          PointerType *pointer)

{
  StringRefType *pSVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *value_00;
  size_t sVar2;
  GenericStringRef<char> local_88 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_68;
  GenericStringRef<char> local_58;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_48;
  PointerType *local_38;
  PointerType *pointer_local;
  Ch *pCStack_28;
  SizeType length_local;
  Ch *value_local;
  PointerType *location_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *pGStack_10;
  SchemaErrorCode code_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_38 = pointer;
  pointer_local._4_4_ = length;
  pCStack_28 = value;
  value_local = (Ch *)location;
  location_local._4_4_ = code;
  pGStack_10 = this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue(&local_48,kObjectType);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
            (&this->currentError_,&local_48);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_48);
  pSVar1 = GetValueString();
  GenericStringRef<char>::GenericStringRef(&local_58,pSVar1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            (&local_68,pCStack_28,pointer_local._4_4_,this->allocator_);
  value_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_68);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_58,value_00,this->allocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_68);
  pSVar1 = GetOffsetString();
  GenericStringRef<char>::GenericStringRef(local_88,pSVar1);
  sVar2 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::GetParseErrorOffset(local_38);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember<unsigned_int>
            (&this->currentError_,local_88,(uint)sVar2,this->allocator_);
  AddCurrentError(this,location_local._4_4_,(PointerType *)value_local);
  return;
}

Assistant:

void SchemaErrorPointer(const SchemaErrorCode code, const PointerType& location, const Ch* value, SizeType length, const PointerType& pointer) {
      currentError_ = GValue(kObjectType);
      currentError_.AddMember(GetValueString(), GValue(value, length, *allocator_).Move(), *allocator_);
      currentError_.AddMember(GetOffsetString(), static_cast<SizeType>(pointer.GetParseErrorOffset() / sizeof(Ch)), *allocator_);
      AddCurrentError(code, location);
    }